

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthesis.cpp
# Opt level: O0

void anon_unknown.dwarf_a40::GetPeriodicResponse
               (int fft_size,double *spectrum,double *aperiodic_ratio,double current_vuv,
               InverseRealFFT *inverse_real_fft,MinimumPhaseAnalysis *minimum_phase,
               double *dc_remover,double fractional_time_shift,int fs,double *periodic_response)

{
  double dVar1;
  fft_plan p;
  int iVar2;
  int iVar3;
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  double local_60;
  double coefficient;
  int local_50;
  int i_2;
  int i_1;
  int i;
  double fractional_time_shift_local;
  double *dc_remover_local;
  MinimumPhaseAnalysis *minimum_phase_local;
  InverseRealFFT *inverse_real_fft_local;
  double current_vuv_local;
  double *aperiodic_ratio_local;
  double *spectrum_local;
  int fft_size_local;
  
  if ((current_vuv <= 0.5) || (0.999 < *aperiodic_ratio)) {
    for (i_2 = 0; i_2 < fft_size; i_2 = i_2 + 1) {
      periodic_response[i_2] = 0.0;
    }
  }
  else {
    _i_1 = fractional_time_shift;
    fractional_time_shift_local = (double)dc_remover;
    dc_remover_local = (double *)minimum_phase;
    minimum_phase_local = (MinimumPhaseAnalysis *)inverse_real_fft;
    inverse_real_fft_local = (InverseRealFFT *)current_vuv;
    current_vuv_local = (double)aperiodic_ratio;
    aperiodic_ratio_local = spectrum;
    spectrum_local._4_4_ = fft_size;
    for (local_50 = 0; local_50 <= *(int *)dc_remover_local / 2; local_50 = local_50 + 1) {
      dVar1 = log(aperiodic_ratio_local[local_50] *
                  (1.0 - *(double *)((long)current_vuv_local + (long)local_50 * 8)) + 1e-12);
      *(double *)((long)dc_remover_local[1] + (long)local_50 * 8) = dVar1 / 2.0;
    }
    iVar3 = local_50;
    GetMinimumPhaseSpectrum((MinimumPhaseAnalysis *)dc_remover_local);
    for (coefficient._4_4_ = 0; coefficient._4_4_ <= spectrum_local._4_4_ / 2;
        coefficient._4_4_ = coefficient._4_4_ + 1) {
      minimum_phase_local->minimum_phase_spectrum[coefficient._4_4_][0] =
           *(double *)((long)dc_remover_local[2] + (long)coefficient._4_4_ * 0x10);
      minimum_phase_local->minimum_phase_spectrum[coefficient._4_4_][1] =
           *(double *)((long)dc_remover_local[2] + (long)coefficient._4_4_ * 0x10 + 8);
    }
    local_60 = (_i_1 * 6.283185307179586 * (double)fs) / (double)spectrum_local._4_4_;
    iVar2 = coefficient._4_4_;
    GetSpectrumWithFractionalTimeShift
              (spectrum_local._4_4_,local_60,(InverseRealFFT *)minimum_phase_local);
    memcpy(local_a8,&minimum_phase_local->cepstrum,0x48);
    p._8_8_ = local_98;
    p.n = (undefined4)uStack_a0;
    p.sign = uStack_a0._4_4_;
    p.c_in = (fft_complex *)uStack_90;
    p.in = (double *)local_88;
    p.c_out = (fft_complex *)uStack_80;
    p.out = (double *)local_78;
    p.input = (double *)uStack_70;
    p.ip = (int *)local_68;
    p.w._0_4_ = iVar2;
    p.w._4_4_ = iVar3;
    fft_execute(p);
    fftshift(minimum_phase_local->log_spectrum,spectrum_local._4_4_,periodic_response);
    RemoveDCComponent(periodic_response,spectrum_local._4_4_,(double *)fractional_time_shift_local,
                      periodic_response);
  }
  return;
}

Assistant:

static void GetPeriodicResponse(int fft_size, const double *spectrum,
    const double *aperiodic_ratio, double current_vuv,
    const InverseRealFFT *inverse_real_fft,
    const MinimumPhaseAnalysis *minimum_phase, const double *dc_remover,
    double fractional_time_shift, int fs, double *periodic_response) {
  if (current_vuv <= 0.5 || aperiodic_ratio[0] > 0.999) {
    for (int i = 0; i < fft_size; ++i) periodic_response[i] = 0.0;
    return;
  }

  for (int i = 0; i <= minimum_phase->fft_size / 2; ++i)
    minimum_phase->log_spectrum[i] =
      log(spectrum[i] * (1.0 - aperiodic_ratio[i]) +
      world::kMySafeGuardMinimum) / 2.0;
  GetMinimumPhaseSpectrum(minimum_phase);

  for (int i = 0; i <= fft_size / 2; ++i) {
    inverse_real_fft->spectrum[i][0] =
      minimum_phase->minimum_phase_spectrum[i][0];
    inverse_real_fft->spectrum[i][1] =
      minimum_phase->minimum_phase_spectrum[i][1];
  }

  // apply fractional time delay of fractional_time_shift seconds
  // using linear phase shift
  double coefficient =
    2.0 * world::kPi * fractional_time_shift * fs / fft_size;
  GetSpectrumWithFractionalTimeShift(fft_size, coefficient, inverse_real_fft);

  fft_execute(inverse_real_fft->inverse_fft);
  fftshift(inverse_real_fft->waveform, fft_size, periodic_response);
  RemoveDCComponent(periodic_response, fft_size, dc_remover,
      periodic_response);
}